

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridWavelet.cpp
# Opt level: O1

MultiIndexSet * __thiscall
TasGrid::GridWavelet::getRefinementCanidates
          (MultiIndexSet *__return_storage_ptr__,GridWavelet *this,double tolerance,
          TypeRefinement criteria,int output,vector<int,_std::allocator<int>_> *level_limits)

{
  MultiIndexSet *this_00;
  uint uVar1;
  int point;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int j;
  long lVar6;
  int *p;
  pointer piVar7;
  int *piVar8;
  vector<int,_std::allocator<int>_> parent;
  Data2D<int> pmap;
  allocator_type local_e9;
  long local_e8;
  int *local_e0;
  long local_d8;
  undefined1 local_d0 [16];
  vector<int,_std::allocator<int>_> local_c0;
  undefined1 local_a8 [16];
  pointer piStack_98;
  pointer local_90;
  pointer piStack_88;
  Data2D<int> local_80;
  Data2D<int> local_58;
  
  buildUpdateMap(&local_58,this,tolerance,criteria,output);
  local_d8 = CONCAT44(local_d8._4_4_,criteria);
  local_80.stride = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  local_80.num_strips = 0;
  local_80.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_80.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_80.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar1 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  local_e0 = (int *)(ulong)uVar1;
  if ((level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    if (0 < (int)uVar1) {
      local_e8 = local_58.stride << 2;
      piVar8 = (int *)0x0;
      piVar7 = local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
          lVar6 = 0;
          do {
            if ((piVar7[lVar6] == 1) &&
               (((criteria & ~refine_direction_selective) != refine_parents_first ||
                (bVar3 = addParent(this,(this->super_BaseCanonicalGrid).points.indexes.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start +
                                        (this->super_BaseCanonicalGrid).points.num_dimensions *
                                        (long)piVar8,(int)lVar6,&local_80), !bVar3)))) {
              addChild(this,(this->super_BaseCanonicalGrid).points.indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start +
                            (this->super_BaseCanonicalGrid).points.num_dimensions * (long)piVar8,
                       (int)lVar6,&local_80);
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < (this->super_BaseCanonicalGrid).num_dimensions);
        }
        piVar8 = (int *)((long)piVar8 + 1);
        piVar7 = (pointer)((long)piVar7 + local_e8);
      } while (piVar8 != local_e0);
    }
  }
  else if (0 < (int)uVar1) {
    local_e8 = local_58.stride << 2;
    piVar8 = (int *)0x0;
    piVar7 = local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (0 < (this->super_BaseCanonicalGrid).num_dimensions) {
        lVar6 = 0;
        do {
          if ((piVar7[lVar6] == 1) &&
             (((criteria & ~refine_direction_selective) != refine_parents_first ||
              (bVar3 = addParent(this,(this->super_BaseCanonicalGrid).points.indexes.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start +
                                      (this->super_BaseCanonicalGrid).points.num_dimensions *
                                      (long)piVar8,(int)lVar6,&local_80), !bVar3)))) {
            addChildLimited(this,(this->super_BaseCanonicalGrid).points.indexes.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start +
                                 (this->super_BaseCanonicalGrid).points.num_dimensions *
                                 (long)piVar8,(int)lVar6,level_limits,&local_80);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (this->super_BaseCanonicalGrid).num_dimensions);
      }
      piVar8 = (int *)((long)piVar8 + 1);
      piVar7 = (pointer)((long)piVar7 + local_e8);
    } while (piVar8 != local_e0);
  }
  if ((int)local_80.num_strips < 1) {
    __return_storage_ptr__->num_dimensions = 0;
    __return_storage_ptr__->cache_num_indexes = 0;
    (__return_storage_ptr__->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    MultiIndexSet::MultiIndexSet(__return_storage_ptr__,&local_80);
  }
  if ((int)local_d8 == 4) {
    this_00 = &(this->super_BaseCanonicalGrid).points;
    do {
      local_a8._0_8_ = SEXT48((this->super_BaseCanonicalGrid).num_dimensions);
      local_90 = (pointer)0x0;
      piStack_88 = (pointer)0x0;
      local_a8._8_8_ = 0;
      piStack_98 = (pointer)0x0;
      local_d8 = (long)__return_storage_ptr__->cache_num_indexes;
      if (0 < local_d8) {
        lVar6 = 0;
        do {
          piVar8 = (__return_storage_ptr__->indexes).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start +
                   __return_storage_ptr__->num_dimensions * lVar6;
          ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
                    ((vector<int,std::allocator<int>> *)local_d0,piVar8,
                     piVar8 + __return_storage_ptr__->num_dimensions,&local_e9);
          local_e0 = (int *)local_d0._8_8_;
          piVar8 = (int *)local_d0._0_8_;
          local_e8 = lVar6;
          if (local_d0._0_8_ != local_d0._8_8_) {
            do {
              point = *piVar8;
              iVar4 = RuleWavelet::getParent(&this->rule1D,point);
              *piVar8 = iVar4;
              if (((-1 < iVar4) &&
                  (iVar4 = MultiIndexSet::getSlot(__return_storage_ptr__,(int *)local_d0._0_8_),
                  iVar4 == -1)) &&
                 (iVar4 = MultiIndexSet::getSlot(this_00,(int *)local_d0._0_8_), iVar4 == -1)) {
                ::std::vector<int,std::allocator<int>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                          ((vector<int,std::allocator<int>> *)&piStack_98,local_90,local_d0._0_8_,
                           (int *)(local_d0._0_8_ + local_a8._0_8_ * 4));
                local_a8._8_8_ = local_a8._8_8_ + 1;
              }
              if (*piVar8 == -2) {
                for (iVar4 = 0; iVar5 = RuleWavelet::getNumPoints(&this->rule1D,0), iVar4 < iVar5;
                    iVar4 = iVar4 + 1) {
                  *piVar8 = iVar4;
                  iVar5 = MultiIndexSet::getSlot(__return_storage_ptr__,(int *)local_d0._0_8_);
                  if ((iVar5 == -1) &&
                     (iVar5 = MultiIndexSet::getSlot(this_00,(int *)local_d0._0_8_), iVar5 == -1)) {
                    ::std::vector<int,std::allocator<int>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                              ((vector<int,std::allocator<int>> *)&piStack_98,local_90,
                               local_d0._0_8_,(int *)(local_d0._0_8_ + local_a8._0_8_ * 4));
                    local_a8._8_8_ = local_a8._8_8_ + 1;
                  }
                }
              }
              *piVar8 = point;
              piVar8 = piVar8 + 1;
            } while (piVar8 != local_e0);
          }
          if ((int *)local_d0._0_8_ != (int *)0x0) {
            operator_delete((void *)local_d0._0_8_,
                            (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start - local_d0._0_8_);
          }
          lVar6 = local_e8 + 1;
        } while (lVar6 != local_d8);
      }
      uVar2 = local_a8._8_4_;
      if (local_a8._8_4_ != 0) {
        MultiIndexSet::MultiIndexSet((MultiIndexSet *)local_d0,(Data2D<int> *)local_a8);
        __return_storage_ptr__->num_dimensions = local_d0._0_8_;
        MultiIndexSet::addSortedIndexes(__return_storage_ptr__,&local_c0);
        if (local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      if (piStack_98 != (pointer)0x0) {
        operator_delete(piStack_98,(long)piStack_88 - (long)piStack_98);
      }
    } while (uVar2 != 0);
  }
  if (local_80.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

MultiIndexSet GridWavelet::getRefinementCanidates(double tolerance, TypeRefinement criteria, int output, const std::vector<int> &level_limits) const{
    Data2D<int> pmap = buildUpdateMap(tolerance, criteria, output);

    bool useParents = (criteria == refine_fds) || (criteria == refine_parents_first);

    Data2D<int> refined(num_dimensions, 0);

    int num_points = points.getNumIndexes();

    #ifdef _OPENMP
    #pragma omp parallel
    {
        Data2D<int> lrefined(num_dimensions, 0);

        if (level_limits.empty()){
            #pragma omp for
            for(int i=0; i<num_points; i++){
                const int *map = pmap.getStrip(i);
                for(int j=0; j<num_dimensions; j++){
                    if (map[j] == 1){ // if this dimension needs to be refined
                        if (!(useParents && addParent(points.getIndex(i), j, lrefined))){
                            addChild(points.getIndex(i), j, lrefined);
                        }
                    }
                }
            }
        }else{
            #pragma omp for
            for(int i=0; i<num_points; i++){
                const int *map = pmap.getStrip(i);
                for(int j=0; j<num_dimensions; j++){
                    if (map[j] == 1){ // if this dimension needs to be refined
                        if (!(useParents && addParent(points.getIndex(i), j, lrefined))){
                            addChildLimited(points.getIndex(i), j, level_limits, lrefined);
                        }
                    }
                }
            }
        }

        #pragma omp critical
        {
            refined.append(lrefined);
        }
    }
    #else
    if (level_limits.empty()){
        for(int i=0; i<num_points; i++){
            int *p = pmap.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (p[j] == 1){ // if this dimension needs to be refined
                    if (!(useParents && addParent(points.getIndex(i), j, refined))){
                        addChild(points.getIndex(i), j, refined);
                    }
                }
            }
        }
    }else{
        for(int i=0; i<num_points; i++){
            int *p = pmap.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (p[j] == 1){ // if this dimension needs to be refined
                    if (!(useParents && addParent(points.getIndex(i), j, refined))){
                        addChildLimited(points.getIndex(i), j, level_limits, refined);
                    }
                }
            }
        }
    }
    #endif

    MultiIndexSet result = (refined.getNumStrips() > 0) ? MultiIndexSet(refined) : MultiIndexSet();

    if (criteria == refine_stable){ // complete needed to a lower set
        size_t num_added = 1; // set to 1 to start the loop
        while(num_added > 0){
            Data2D<int> addons(num_dimensions, 0);
            int num_needed = result.getNumIndexes();

            for(int i=0; i<num_needed; i++){
                std::vector<int> parent = result.copyIndex(i);
                for(auto &p : parent){
                    int r = p;
                    p = rule1D.getParent(r);
                    if ((p > -1) && result.missing(parent) && points.missing(parent))
                        addons.appendStrip(parent);
                    if (p == -2){ // all parents on level 0
                        for(int j=0; j<rule1D.getNumPoints(0); j++){
                            p = j;
                            if (result.missing(parent) && points.missing(parent))
                                addons.appendStrip(parent);
                        }
                    }
                    p = r;
                }
            }

            num_added = addons.getNumStrips();
            if (num_added > 0)
                result += addons;
        }
    }

    return result;
}